

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O0

tchar_t * GetProtocol(tchar_t *URL,tchar_t *Proto,int ProtoLen,bool_t *HasHost)

{
  int iVar1;
  char *pcVar2;
  bool_t bVar3;
  bool bVar4;
  bool local_32;
  char *local_30;
  tchar_t *s;
  bool_t *HasHost_local;
  int ProtoLen_local;
  tchar_t *Proto_local;
  tchar_t *URL_local;
  
  pcVar2 = strchr(URL,0x3a);
  if (((pcVar2 == (char *)0x0) || (pcVar2[1] != '/')) || (Proto_local = URL, pcVar2[2] != '/')) {
    if (HasHost != (bool_t *)0x0) {
      *HasHost = 0;
    }
    local_30 = URL;
    if (Proto != (tchar_t *)0x0) {
      tcscpy_s(Proto,(long)ProtoLen,"file");
    }
  }
  else {
    while( true ) {
      bVar4 = false;
      if (Proto_local < pcVar2) {
        bVar3 = IsSpace((int)*Proto_local);
        bVar4 = bVar3 != 0;
      }
      if (!bVar4) break;
      Proto_local = Proto_local + 1;
    }
    if (Proto != (tchar_t *)0x0) {
      tcsncpy_s(Proto,(long)ProtoLen,Proto_local,(long)pcVar2 - (long)Proto_local);
    }
    if (HasHost != (bool_t *)0x0) {
      iVar1 = tcsnicmp(Proto_local,"file",4);
      local_32 = false;
      if (iVar1 != 0) {
        iVar1 = tcsnicmp(Proto_local,"conf",3);
        local_32 = false;
        if (iVar1 != 0) {
          iVar1 = tcsnicmp(Proto_local,"res",3);
          local_32 = false;
          if (iVar1 != 0) {
            iVar1 = tcsnicmp(Proto_local,"root",4);
            local_32 = false;
            if (iVar1 != 0) {
              iVar1 = tcsnicmp(Proto_local,"mem",3);
              local_32 = false;
              if (iVar1 != 0) {
                iVar1 = tcsnicmp(Proto_local,"pose",4);
                local_32 = false;
                if (iVar1 != 0) {
                  iVar1 = tcsnicmp(Proto_local,"vol",3);
                  local_32 = false;
                  if (iVar1 != 0) {
                    iVar1 = tcsnicmp(Proto_local,"slot",4);
                    local_32 = false;
                    if (iVar1 != 0) {
                      iVar1 = tcsnicmp(Proto_local,"simu",4);
                      local_32 = false;
                      if (iVar1 != 0) {
                        iVar1 = tcsnicmp(Proto_local,"local",5);
                        local_32 = false;
                        if (iVar1 != 0) {
                          iVar1 = tcsnicmp(Proto_local,"sdcard",6);
                          local_32 = iVar1 != 0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      *HasHost = (long)(int)(uint)local_32;
    }
    local_30 = pcVar2 + 3;
  }
  return local_30;
}

Assistant:

const tchar_t* GetProtocol(const tchar_t* URL, tchar_t* Proto, int ProtoLen, bool_t* HasHost)
{
    const tchar_t* s = tcschr(URL,':');
    if (s && s[1] == '/' && s[2] == '/')
    {
        while (URL<s && IsSpace(*URL)) ++URL;
        if (Proto)
            tcsncpy_s(Proto,ProtoLen,URL,s-URL);
        if (HasHost)
        {
            *HasHost = tcsnicmp(URL,T("file"),4)!=0 &&
                       tcsnicmp(URL,T("conf"),3)!=0 &&
                       tcsnicmp(URL,T("res"),3)!=0 &&
                       tcsnicmp(URL,T("root"),4)!=0 &&
                       tcsnicmp(URL,T("mem"),3)!=0 &&
                       tcsnicmp(URL,T("pose"),4)!=0 &&
                       tcsnicmp(URL,T("vol"),3)!=0 &&
                       tcsnicmp(URL,T("slot"),4)!=0 &&
                       tcsnicmp(URL,T("simu"),4)!=0 &&
                       tcsnicmp(URL,T("local"),5)!=0 &&
                       tcsnicmp(URL,T("sdcard"),6)!=0;
        }
        s += 3;
    }
    else
    {
        if (HasHost)
            *HasHost = 0;
        if (Proto)
            tcscpy_s(Proto,ProtoLen,T("file"));
        s = URL;
    }
    return s;
}